

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermAggregate * __thiscall
glslang::TIntermediate::makeAggregate(TIntermediate *this,TIntermNode *node,TSourceLoc *loc)

{
  TIntermediate *this_00;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_01;
  TIntermAggregate *aggNode;
  TSourceLoc *loc_local;
  TIntermNode *node_local;
  TIntermediate *this_local;
  
  if (node == (TIntermNode *)0x0) {
    this_local = (TIntermediate *)0x0;
  }
  else {
    loc_local = (TSourceLoc *)node;
    node_local = (TIntermNode *)this;
    this_00 = (TIntermediate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)node);
    TIntermAggregate::TIntermAggregate((TIntermAggregate *)this_00);
    this_01 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
              (**(code **)(*(long *)this_00 + 400))();
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
              (this_01,(value_type *)&loc_local);
    (**(code **)(*(long *)this_00 + 8))(this_00,loc);
    this_local = this_00;
  }
  return (TIntermAggregate *)this_local;
}

Assistant:

TIntermAggregate* TIntermediate::makeAggregate(TIntermNode* node, const TSourceLoc& loc)
{
    if (node == nullptr)
        return nullptr;

    TIntermAggregate* aggNode = new TIntermAggregate;
    aggNode->getSequence().push_back(node);
    aggNode->setLoc(loc);

    return aggNode;
}